

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O2

ExprNode * __thiscall Translator::visit(Translator *this,NameExpNode *nameExpNode)

{
  int iVar1;
  VarSymbol *pVVar2;
  MEM *this_00;
  BINOP *this_01;
  undefined4 extraout_var;
  ExprNode *right;
  
  pVVar2 = VarTable::searchInScope
                     (this->varTable,(nameExpNode->id->super_ExpNode).lexeme,
                      nameExpNode->exp->typeLexeme);
  if (pVVar2 == (VarSymbol *)0x0) {
    this_00 = (MEM *)0x0;
  }
  else {
    this_00 = (MEM *)operator_new(0x18);
    this_01 = (BINOP *)operator_new(0x20);
    iVar1 = (*(nameExpNode->exp->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                      (nameExpNode->exp,this);
    right = (ExprNode *)operator_new(0x10);
    CONST::CONST((CONST *)right,pVVar2->offset);
    BINOP::BINOP(this_01,0x2c,(ExprNode *)CONCAT44(extraout_var,iVar1),right);
    MEM::MEM(this_00,(ExprNode *)this_01);
  }
  return &this_00->super_ExprNode;
}

Assistant:

ExprNode *Translator::visit(NameExpNode *nameExpNode) {
    // TODO aqui eu to pegando a variavel e consequentemente as informacoes de tamanho/offset que ela pertence?
    VarSymbol *var = varTable->searchInScope(nameExpNode->getId()->getLexeme(), nameExpNode->getExp()->getTypeLexeme());
    if (var) {
        return new MEM(new BINOP(PLUS, nameExpNode->getExp()->accept(this), new CONST(var->getOffset())));
    } else {
        return NULL;
    }
}